

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.h
# Opt level: O0

ptime booster::ptime::from_number(double d)

{
  int iVar1;
  ptime *this;
  double in_XMM0_Qa;
  double dVar2;
  ptime pVar3;
  int nano;
  longlong seconds;
  double subsec;
  double sec;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 local_10 [12];
  
  dVar2 = floor(in_XMM0_Qa);
  this = (ptime *)(long)dVar2;
  dVar2 = floor((in_XMM0_Qa - dVar2) * 1000000000.0);
  iVar1 = (int)dVar2;
  if (iVar1 < 0) {
    iVar1 = 0;
  }
  if (999999999 < iVar1) {
    iVar1 = 999999999;
  }
  ptime(this,CONCAT44(iVar1,in_stack_ffffffffffffffc8),0);
  pVar3._12_4_ = 0;
  pVar3._0_12_ = local_10;
  return pVar3;
}

Assistant:

static ptime from_number(double d)
		{
			double sec = floor(d);
			double subsec = d-sec;
			long long seconds = static_cast<long long>(sec);
			int nano = static_cast<int>(floor(subsec * 1e9));
			if(nano < 0) nano = 0;
			if(nano >= one_e9) nano = one_e9-1;
			return ptime(seconds,nano);
		}